

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void av1_dr_prediction_z2_c
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int upsample_left,int dx,int dy)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int shift_1;
  int base_y;
  int shift;
  int base_x;
  int x;
  int y;
  int val;
  int c;
  int r;
  int frac_bits_y;
  int frac_bits_x;
  int min_base_y;
  int min_base_x;
  uint8_t *left_local;
  uint8_t *above_local;
  int bh_local;
  int bw_local;
  ptrdiff_t stride_local;
  uint8_t *dst_local;
  
  bVar3 = (byte)upsample_above;
  dst_local = dst;
  for (r = 0; r < bh; r = r + 1) {
    for (c = 0; c < bw; c = c + 1) {
      iVar1 = c * 0x40 - (r + 1) * dx;
      iVar2 = iVar1 >> (6 - bVar3 & 0x1f);
      if (iVar2 < -(1 << (bVar3 & 0x1f))) {
        iVar1 = r * 0x40 - (c + 1) * dy;
        iVar2 = iVar1 >> (6 - (byte)upsample_left & 0x1f);
        iVar1 = (int)(iVar1 * (1 << ((byte)upsample_left & 0x1f)) & 0x3fU) >> 1;
        val._0_1_ = (uint8_t)((int)((uint)left[iVar2] * (0x20 - iVar1) +
                                    (uint)left[iVar2 + 1] * iVar1 + 0x10) >> 5);
      }
      else {
        iVar1 = (int)(iVar1 * (1 << (bVar3 & 0x1f)) & 0x3fU) >> 1;
        val._0_1_ = (uint8_t)((int)((uint)above[iVar2] * (0x20 - iVar1) +
                                    (uint)above[iVar2 + 1] * iVar1 + 0x10) >> 5);
      }
      dst_local[c] = (uint8_t)val;
    }
    dst_local = dst_local + stride;
  }
  return;
}

Assistant:

void av1_dr_prediction_z2_c(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                            const uint8_t *above, const uint8_t *left,
                            int upsample_above, int upsample_left, int dx,
                            int dy) {
  assert(dx > 0);
  assert(dy > 0);

  const int min_base_x = -(1 << upsample_above);
  const int min_base_y = -(1 << upsample_left);
  (void)min_base_y;
  const int frac_bits_x = 6 - upsample_above;
  const int frac_bits_y = 6 - upsample_left;

  for (int r = 0; r < bh; ++r) {
    for (int c = 0; c < bw; ++c) {
      int val;
      int y = r + 1;
      int x = (c << 6) - y * dx;
      const int base_x = x >> frac_bits_x;
      if (base_x >= min_base_x) {
        const int shift = ((x * (1 << upsample_above)) & 0x3F) >> 1;
        val = above[base_x] * (32 - shift) + above[base_x + 1] * shift;
        val = ROUND_POWER_OF_TWO(val, 5);
      } else {
        x = c + 1;
        y = (r << 6) - x * dy;
        const int base_y = y >> frac_bits_y;
        assert(base_y >= min_base_y);
        const int shift = ((y * (1 << upsample_left)) & 0x3F) >> 1;
        val = left[base_y] * (32 - shift) + left[base_y + 1] * shift;
        val = ROUND_POWER_OF_TWO(val, 5);
      }
      dst[c] = val;
    }
    dst += stride;
  }
}